

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::FindMakeProgram(cmGlobalGenerator *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  ulong uVar2;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  bool local_3e1;
  bool local_391;
  allocator local_369;
  string local_368;
  string local_348 [8];
  string saveFile;
  string file;
  string dir;
  string local_2e0;
  undefined1 local_2c0 [8];
  string makeProgram;
  string local_280 [32];
  ostringstream local_260 [8];
  ostringstream err;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string setMakeProgram;
  string local_70;
  allocator local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmGlobalGenerator *this_local;
  
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    cmSystemTools::Error
              ("Generator implementation error, all generators must specify this->FindMakeProgramFile"
               ,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  setMakeProgram.field_2._M_local_buf[0xe] = '\0';
  setMakeProgram.field_2._M_local_buf[0xd] = '\0';
  std::__cxx11::string::string((string *)&local_38,"CMAKE_MAKE_PROGRAM",&local_39);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_38);
  pcVar1 = local_18;
  local_391 = true;
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    setMakeProgram.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string
              ((string *)&local_70,"CMAKE_MAKE_PROGRAM",
               (allocator *)(setMakeProgram.field_2._M_local_buf + 0xf));
    setMakeProgram.field_2._M_local_buf[0xd] = '\x01';
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_70);
    local_391 = cmSystemTools::IsOff(pcVar3);
  }
  if ((setMakeProgram.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((setMakeProgram.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(setMakeProgram.field_2._M_local_buf + 0xf))
    ;
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = local_18;
  if (local_391 != false) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::GetModulesFile_abi_cxx11_((string *)local_98,pcVar1,pcVar3);
    uVar2 = std::__cxx11::string::empty();
    pcVar1 = local_18;
    if ((uVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::ReadListFile(pcVar1,pcVar3);
    }
    std::__cxx11::string::~string((string *)local_98);
  }
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"CMAKE_MAKE_PROGRAM",&local_b9);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_b8);
  pcVar1 = local_18;
  local_3e1 = true;
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"CMAKE_MAKE_PROGRAM",&local_e1);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_e0);
    local_3e1 = cmSystemTools::IsOff(pcVar3);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pcVar1 = local_18;
  if (local_3e1 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2e0,"CMAKE_MAKE_PROGRAM",
               (allocator *)(dir.field_2._M_local_buf + 0xf));
    pcVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_2c0,pcVar3,(allocator *)(dir.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
    lVar5 = std::__cxx11::string::find((char)local_2c0,0x20);
    if (lVar5 != -1) {
      std::__cxx11::string::string((string *)(file.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(saveFile.field_2._M_local_buf + 8));
      cmsys::SystemTools::SplitProgramPath
                ((string *)local_2c0,(string *)(file.field_2._M_local_buf + 8),
                 (string *)(saveFile.field_2._M_local_buf + 8),true);
      std::__cxx11::string::string(local_348,(string *)(saveFile.field_2._M_local_buf + 8));
      cmsys::SystemTools::GetShortPath((string *)local_2c0,(string *)local_2c0);
      cmsys::SystemTools::SplitProgramPath
                ((string *)local_2c0,(string *)((long)&file.field_2 + 8),
                 (string *)((long)&saveFile.field_2 + 8),true);
      std::__cxx11::string::operator=((string *)local_2c0,(string *)(file.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::operator+=((string *)local_2c0,"/");
      std::__cxx11::string::operator+=((string *)local_2c0,local_348);
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_368,"CMAKE_MAKE_PROGRAM",&local_369);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition(pcVar1,&local_368,pcVar3,"make program",FILEPATH,false);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      std::__cxx11::string::~string(local_348);
      std::__cxx11::string::~string((string *)(saveFile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_2c0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_260);
    poVar4 = std::operator<<((ostream *)local_260,
                             "CMake was unable to find a build program corresponding to \"");
    (*this->_vptr_cmGlobalGenerator[2])(local_280);
    poVar4 = std::operator<<(poVar4,local_280);
    poVar4 = std::operator<<(poVar4,"\".  CMAKE_MAKE_PROGRAM is not set.  You ");
    std::operator<<(poVar4,"probably need to select a different build tool.");
    std::__cxx11::string::~string(local_280);
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)(makeProgram.field_2._M_local_buf + 8));
    cmSystemTools::SetFatalErrorOccured();
    std::__cxx11::ostringstream::~ostringstream(local_260);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FindMakeProgram(cmMakefile* mf)
{
  if(this->FindMakeProgramFile.empty())
    {
    cmSystemTools::Error(
      "Generator implementation error, "
      "all generators must specify this->FindMakeProgramFile");
    }
  if(!mf->GetDefinition("CMAKE_MAKE_PROGRAM")
     || cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM")))
    {
    std::string setMakeProgram =
      mf->GetModulesFile(this->FindMakeProgramFile.c_str());
    if(!setMakeProgram.empty())
      {
      mf->ReadListFile(setMakeProgram.c_str());
      }
    }
  if(!mf->GetDefinition("CMAKE_MAKE_PROGRAM")
     || cmSystemTools::IsOff(mf->GetDefinition("CMAKE_MAKE_PROGRAM")))
    {
    std::ostringstream err;
    err << "CMake was unable to find a build program corresponding to \""
        << this->GetName() << "\".  CMAKE_MAKE_PROGRAM is not set.  You "
        << "probably need to select a different build tool.";
    cmSystemTools::Error(err.str().c_str());
    cmSystemTools::SetFatalErrorOccured();
    return;
    }
  std::string makeProgram = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  // if there are spaces in the make program use short path
  // but do not short path the actual program name, as
  // this can cause trouble with VSExpress
  if(makeProgram.find(' ') != makeProgram.npos)
    {
    std::string dir;
    std::string file;
    cmSystemTools::SplitProgramPath(makeProgram,
                                    dir, file);
    std::string saveFile = file;
    cmSystemTools::GetShortPath(makeProgram, makeProgram);
    cmSystemTools::SplitProgramPath(makeProgram,
                                    dir, file);
    makeProgram = dir;
    makeProgram += "/";
    makeProgram += saveFile;
    mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", makeProgram.c_str(),
                           "make program",
                           cmState::FILEPATH);
    }
}